

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerLib.cpp
# Opt level: O3

void __thiscall ServerLib::ServerLib(ServerLib *this,int port)

{
  this->port = port;
  this->server_fd = 0;
  this->opt = 1;
  this->addrlen = 0x10;
  this->debugFlag = false;
  (this->url_options).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->url_options).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->url_options).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  WebBinder::WebBinder(&this->webBinder);
  *(ServerLib **)&(this->thread_action).super__Function_base._M_functor = this;
  *(undefined8 *)((long)&(this->thread_action).super__Function_base._M_functor + 8) = 0;
  (this->thread_action).super__Function_base._M_manager =
       std::
       _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/trygve55[P]Simple-HTTP-2-Web-Server/SimpleHTTP2server/ServerLib.cpp:10:19)>
       ::_M_manager;
  (this->thread_action)._M_invoker =
       std::
       _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/trygve55[P]Simple-HTTP-2-Web-Server/SimpleHTTP2server/ServerLib.cpp:10:19)>
       ::_M_invoke;
  return;
}

Assistant:

ServerLib::ServerLib(int port) : port(port) {
  // Temporary
  thread_action = [this](int socket) {
      char buffer[BUFFERSIZE] = {0};
      std::cout << "Client Connected" << std::endl;
        
      read(socket, buffer, BUFFERSIZE);
      
      Header header = ParseHeader(buffer);
      
      //std::cout << header.getHTTP() << std::endl;
      
      //std::cout << header.getHeaderline("upgrade") << std::endl;
      
      if (header.getHeaderline("upgrade").compare("h2c") == 0) {
          //Upgrade connection to HTTP2(h2c)
          HTTP2Connection connection(socket, buffer, &webBinder);
      } else {
          //Respond as HTTP 1.1
          stringstream responseStream, bodyStream;
          if (header.getHeaderline(":path").back() == '/') header.setHeaderline(":path", header.getHeaderline(":path") + "index.html");
          std::string path = webBinder.getPath(header.getHeaderline(":path"));
          
          int fSize = ((true) ? read_htmlfile(bodyStream, path) : -1);
          
          if (fSize >= 0) {
              responseStream << "HTTP/1.1 200 OK\r\nContent-length: " << fSize << "\r\n";
              responseStream << "Content-Type: text/html\r\n\r\n";
          } else {
              responseStream << "HTTP/1.1 404 Not Found";
          }
          
          responseStream << bodyStream.rdbuf();
          std::string response = responseStream.str();
          write(socket, response.c_str(), response.length());
          std::cout << "Response sent" << std::endl;
          
          close(socket);
      }
      return 0;
  };
}